

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::iterator,_bool>
* __thiscall
google::protobuf::Map<std::__cxx11::string,int>::
TryEmplaceInternal<std::__cxx11::string_const&,int_const&>
          (pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::iterator,_bool>
           *__return_storage_ptr__,Map<std::__cxx11::string,int> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,int *args)

{
  BaseIt it;
  BaseIt it_00;
  undefined8 args_00;
  bool bVar1;
  NodeBase *node_00;
  NodeAndBucket NVar2;
  bool local_e9;
  NodeBase *local_e8;
  Map<std::__cxx11::string,int> *local_e0;
  map_index_t local_d8;
  undefined4 uStack_d4;
  iterator local_d0;
  NodeBase *local_b8;
  Node *node;
  bool local_99;
  NodeBase *local_98;
  Map<std::__cxx11::string,int> *local_90;
  map_index_t local_88;
  undefined4 uStack_84;
  iterator local_80;
  map_index_t local_64;
  undefined1 auStack_60 [4];
  map_index_t b;
  NodeBase *local_50;
  NodeAndBucket p;
  int *args_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k_local;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *this_local;
  Node *node_1;
  
  p._8_8_ = args;
  _auStack_60 = internal::TransparentSupport<std::__cxx11::string>::ToView<std::__cxx11::string>(k);
  NVar2 = internal::
          KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::FindHelper((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)this,_auStack_60);
  local_98 = NVar2.node;
  local_88 = NVar2.bucket;
  local_64 = local_88;
  local_50 = local_98;
  p.node._0_4_ = local_88;
  if (local_98 == (NodeBase *)0x0) {
    bVar1 = internal::
            KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::ResizeIfLoadIsOutOfRange
                      ((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)this,(ulong)(*(int *)this + 1));
    if (bVar1) {
      _node = internal::TransparentSupport<std::__cxx11::string>::ToView<std::__cxx11::string>(k);
      local_64 = internal::
                 KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::BucketNumber((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)this,_node);
    }
    args_00 = p._8_8_;
    node_00 = internal::UntypedMapBase::AllocNode((UntypedMapBase *)this,0x30);
    bVar1 = internal::InitializeMapKey<std::__cxx11::string,std::__cxx11::string_const&>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (node_00 + 1),k,*(Arena **)(this + 0x18));
    if (!bVar1) {
      Arena::CreateInArenaStorage<std::__cxx11::string,std::__cxx11::string_const&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(node_00 + 1),
                 *(Arena **)(this + 0x18),k);
    }
    Arena::CreateInArenaStorage<int,int_const&>
              ((int *)(node_00 + 5),*(Arena **)(this + 0x18),(int *)args_00);
    local_b8 = node_00;
    internal::
    KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    InsertUnique((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this,local_64,(KeyNode *)node_00);
    *(int *)this = *(int *)this + 1;
    local_e8 = local_b8;
    local_d8 = local_64;
    it_00._20_4_ = uStack_d4;
    it_00.bucket_index_ = local_64;
    it_00.m_ = (UntypedMapBase *)this;
    it_00.node_ = local_b8;
    local_e0 = this;
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
    iterator::iterator(&local_d0,it_00);
    local_e9 = true;
    std::make_pair<google::protobuf::Map<std::__cxx11::string,int>::iterator,bool>
              (__return_storage_ptr__,&local_d0,&local_e9);
  }
  else {
    it._20_4_ = uStack_84;
    it.bucket_index_ = local_88;
    it.m_ = (UntypedMapBase *)this;
    it.node_ = local_98;
    local_90 = this;
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
    iterator::iterator(&local_80,it);
    local_99 = false;
    std::make_pair<google::protobuf::Map<std::__cxx11::string,int>::iterator,bool>
              (__return_storage_ptr__,&local_80,&local_99);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> TryEmplaceInternal(K&& k, Args&&... args) {
    auto p = this->FindHelper(TS::ToView(k));
    internal::map_index_t b = p.bucket;
    // Case 1: key was already present.
    if (p.node != nullptr) {
      return std::make_pair(iterator(internal::UntypedMapIterator{
                                static_cast<Node*>(p.node), this, p.bucket}),
                            false);
    }
    // Case 2: insert.
    if (this->ResizeIfLoadIsOutOfRange(this->num_elements_ + 1)) {
      b = this->BucketNumber(TS::ToView(k));
    }
    auto* node = CreateNode(std::forward<K>(k), std::forward<Args>(args)...);
    this->InsertUnique(b, node);
    ++this->num_elements_;
    return std::make_pair(iterator(internal::UntypedMapIterator{node, this, b}),
                          true);
  }